

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mifirstclassarg.cpp
# Opt level: O0

void __thiscall GradeBook::displayMessage(GradeBook *this,string *courseName)

{
  ostream *poVar1;
  string *courseName_local;
  GradeBook *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Welcome to the grade book for\n");
  poVar1 = std::operator<<(poVar1,(string *)courseName);
  poVar1 = std::operator<<(poVar1,"!");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void displayMessage(const std::string &courseName) {
        std::cout << "Welcome to the grade book for\n"
                  << courseName << "!" << std::endl;
    }